

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void Assimp::IFC::ConvertColor
               (aiColor4D *out,IfcColourOrFactor *in,ConversionData *conv,aiColor4D *base)

{
  long lVar1;
  IfcColourRgb *pIVar2;
  float fVar3;
  char *unaff_retaddr;
  
  lVar1 = __dynamic_cast(in,&STEP::EXPRESS::DataType::typeinfo,
                         &STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
  if (lVar1 == 0) {
    pIVar2 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcColourRgb>
                       (in,conv->db);
    if (pIVar2 == (IfcColourRgb *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogWarn(unaff_retaddr);
      return;
    }
    out->r = (float)*(double *)&(pIVar2->super_IfcColourSpecification).field_0x48;
    out->g = (float)pIVar2->Green;
    out->b = (float)pIVar2->Blue;
  }
  else {
    fVar3 = (float)*(double *)(lVar1 + 8);
    out->b = fVar3;
    out->g = fVar3;
    out->r = fVar3;
    if (base != (aiColor4D *)0x0) {
      out->r = base->r * fVar3;
      out->g = base->g * fVar3;
      out->b = fVar3 * base->b;
      out->a = base->a;
      return;
    }
  }
  out->a = 1.0;
  return;
}

Assistant:

void ConvertColor(aiColor4D& out, const Schema_2x3::IfcColourOrFactor& in,ConversionData& conv,const aiColor4D* base)
{
    if (const ::Assimp::STEP::EXPRESS::REAL* const r = in.ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
        out.r = out.g = out.b = static_cast<float>(*r);
        if(base) {
            out.r *= static_cast<float>( base->r );
            out.g *= static_cast<float>( base->g );
            out.b *= static_cast<float>( base->b );
            out.a = static_cast<float>( base->a );
        }
        else out.a = 1.0;
    }
    else if (const Schema_2x3::IfcColourRgb* const rgb = in.ResolveSelectPtr<Schema_2x3::IfcColourRgb>(conv.db)) {
        ConvertColor(out,*rgb);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcColourOrFactor entity");
    }
}